

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

int ly_time_tz_offset_at(time_t time)

{
  undefined1 local_80 [4];
  int result;
  tm tm_utc;
  tm tm_local;
  time_t time_local;
  
  tm_local.tm_zone = (char *)time;
  tzset();
  localtime_r((time_t *)&tm_local.tm_zone,(tm *)&tm_utc.tm_zone);
  gmtime_r((time_t *)&tm_local.tm_zone,(tm *)local_80);
  if (tm_local.tm_mday < tm_utc.tm_mday) {
    tm_utc.tm_sec = tm_utc.tm_sec + 0x18;
  }
  else if (tm_utc.tm_mday < tm_local.tm_mday) {
    tm_local.tm_sec = tm_local.tm_sec + 0x18;
  }
  else if (tm_local.tm_hour < tm_utc.tm_hour) {
    tm_utc.tm_sec = tm_utc.tm_sec + 0x18;
  }
  else if (tm_utc.tm_hour < tm_local.tm_hour) {
    tm_local.tm_sec = tm_local.tm_sec + 0x18;
  }
  else if (tm_local.tm_min < tm_utc.tm_min) {
    tm_utc.tm_sec = tm_utc.tm_sec + 0x18;
  }
  else if (tm_utc.tm_min < tm_local.tm_min) {
    tm_local.tm_sec = tm_local.tm_sec + 0x18;
  }
  return ((int)tm_utc.tm_zone - (int)local_80) +
         (tm_utc.tm_zone._4_4_ - result) * 0x3c + (tm_local.tm_sec - tm_utc.tm_sec) * 0xe10;
}

Assistant:

LIBYANG_API_DEF int
ly_time_tz_offset_at(time_t time)
{
    struct tm tm_local, tm_utc;
    int result = 0;

    /* init timezone */
    tzset();

    /* get local and UTC time */
    localtime_r(&time, &tm_local);
    gmtime_r(&time, &tm_utc);

    /* account for year/month/day change by adding/subtracting from the hours, the change cannot be more than 1 day */
    if (tm_local.tm_year < tm_utc.tm_year) {
        tm_utc.tm_hour += 24;
    } else if (tm_local.tm_year > tm_utc.tm_year) {
        tm_local.tm_hour += 24;
    } else if (tm_local.tm_mon < tm_utc.tm_mon) {
        tm_utc.tm_hour += 24;
    } else if (tm_local.tm_mon > tm_utc.tm_mon) {
        tm_local.tm_hour += 24;
    } else if (tm_local.tm_mday < tm_utc.tm_mday) {
        tm_utc.tm_hour += 24;
    } else if (tm_local.tm_mday > tm_utc.tm_mday) {
        tm_local.tm_hour += 24;
    }

    /* hours shift in seconds */
    result += (tm_local.tm_hour - tm_utc.tm_hour) * 3600;

    /* minutes shift in seconds */
    result += (tm_local.tm_min - tm_utc.tm_min) * 60;

    /* seconds shift */
    result += tm_local.tm_sec - tm_utc.tm_sec;

    return result;
}